

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.hpp
# Opt level: O0

VecDoub * __thiscall
Frprmn<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
::minimize(VecDoub *__return_storage_ptr__,
          Frprmn<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
          *this,VecDoub_I *pp)

{
  double dVar1;
  value_type vVar2;
  double dVar3;
  size_type sVar4;
  reference pvVar5;
  ostream *poVar6;
  ulong uVar7;
  double *pdVar8;
  General_Exception *this_00;
  int __x;
  Frprmn<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
  *pFVar9;
  VecDoub *this_01;
  Doub DVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar11;
  allocator local_129;
  string local_128;
  int local_104;
  double dStack_100;
  Int j_3;
  Doub gam;
  double dStack_f0;
  Int j_2;
  double local_e8;
  double local_e0;
  Doub temp;
  double dStack_d0;
  Int j_1;
  double local_c8;
  Doub den;
  Doub test;
  int local_b0;
  uint i;
  Int its;
  Int j;
  Doub fp;
  undefined1 local_98 [8];
  VecDoub h;
  allocator<double> local_69;
  undefined1 local_68 [8];
  VecDoub g;
  double dStack_48;
  Int n;
  Doub dgg;
  Doub gg;
  Doub GTOL;
  Doub EPS;
  Int ITMAX;
  VecDoub_I *pp_local;
  Frprmn<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
  *this_local;
  
  std::numeric_limits<double>::epsilon();
  dVar1 = (this->
          super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
          ).ftol;
  sVar4 = std::vector<double,_std::allocator<double>_>::size(pp);
  g.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (int)sVar4;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)this,pp);
  sVar4 = (size_type)
          g.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  std::allocator<double>::allocator(&local_69);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_68,sVar4,&local_69);
  std::allocator<double>::~allocator(&local_69);
  sVar4 = (size_type)
          g.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  std::allocator<double>::allocator((allocator<double> *)((long)&fp + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_98,sVar4,
             (allocator<double> *)((long)&fp + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&fp + 7));
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->
              super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
              ).xi,(long)g.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_);
  _its = LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>
         ::operator()((this->
                      super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                      ).func,(vector<double,_std::allocator<double>_> *)this);
  LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>
  ::df((this->
       super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
       ).func,(vector<double,_std::allocator<double>_> *)this,
       &(this->
        super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
        ).xi);
  for (i = 0; (int)i < g.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_; i = i + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->
                         super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                         ).xi,(long)(int)i);
    vVar2 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,(long)(int)i);
    *pvVar5 = -vVar2;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,(long)(int)i);
    vVar2 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_98,(long)(int)i);
    *pvVar5 = vVar2;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->
                         super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                         ).xi,(long)(int)i);
    *pvVar5 = vVar2;
  }
  local_b0 = 0;
  while( true ) {
    if (1999999999 < local_b0) {
      this_00 = (General_Exception *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_128,"Too many iterations in frprmn",&local_129);
      General_Exception::General_Exception(this_00,&local_128);
      __cxa_throw(this_00,&General_Exception::typeinfo,General_Exception::~General_Exception);
    }
    if (local_b0 % 100 == 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"#At iteration: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_b0);
      std::operator<<(poVar6," states are:\n");
      std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0x11);
      test._4_4_ = 0;
      while( true ) {
        uVar7 = (ulong)test._4_4_;
        sVar4 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)this);
        if (sVar4 <= uVar7) break;
        poVar6 = std::operator<<((ostream *)&std::cout,"#\t");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,test._4_4_);
        poVar6 = std::operator<<(poVar6,"\t");
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)this,(ulong)test._4_4_);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        test._4_4_ = test._4_4_ + 1;
      }
      std::ostream::flush();
    }
    this->iter = local_b0;
    pFVar9 = this;
    DVar10 = Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
             ::linmin(&this->
                       super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                     );
    __x = (int)pFVar9;
    this->fret = DVar10;
    std::abs(__x);
    dVar11 = (this->
             super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
             ).ftol;
    std::abs(__x);
    std::abs(__x);
    if (extraout_XMM0_Qa + extraout_XMM0_Qa <=
        dVar11 * (extraout_XMM0_Qa_00 + extraout_XMM0_Qa_01 + 2.220446049250313e-16)) break;
    _its = this->fret;
    LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>
    ::df((this->
         super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
         ).func,(vector<double,_std::allocator<double>_> *)this,
         &(this->
          super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
          ).xi);
    den = 0.0;
    dStack_d0 = 1.0;
    pdVar8 = MAX<double>((double *)&its,&stack0xffffffffffffff30);
    local_c8 = *pdVar8;
    for (temp._4_4_ = 0;
        temp._4_4_ <
        g.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; temp._4_4_ = temp._4_4_ + 1) {
      this_01 = &(this->
                 super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                 ).xi;
      std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)temp._4_4_);
      std::abs((int)this_01);
      pFVar9 = this;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)this,(long)temp._4_4_);
      std::abs((int)pFVar9);
      dStack_f0 = 1.0;
      pdVar8 = MAX<double>(&local_e8,&stack0xffffffffffffff10);
      local_e0 = (extraout_XMM0_Qa_02 * *pdVar8) / local_c8;
      if (den < local_e0) {
        den = local_e0;
      }
    }
    if (den < dVar1) {
      std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0x11);
      poVar6 = std::operator<<((ostream *)&std::cout,"#Convergence met at iteration ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_b0);
      poVar6 = std::operator<<(poVar6," because gradient is smaller than ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar1);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::vector<double,_std::allocator<double>_>::vector
                (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)this);
      goto LAB_0019d41b;
    }
    dgg = 0.0;
    dStack_48 = 0.0;
    for (gam._4_4_ = 0;
        gam._4_4_ <
        g.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; gam._4_4_ = gam._4_4_ + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_68,(long)gam._4_4_);
      dVar11 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_68,(long)gam._4_4_);
      dgg = dVar11 * *pvVar5 + dgg;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->
                           super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                           ).xi,(long)gam._4_4_);
      dVar11 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_68,(long)gam._4_4_);
      dVar3 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->
                           super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                           ).xi,(long)gam._4_4_);
      dStack_48 = (dVar11 + dVar3) * *pvVar5 + dStack_48;
    }
    if ((dgg == 0.0) && (!NAN(dgg))) {
      poVar6 = std::operator<<((ostream *)&std::cout,"#Convergence met at iteration ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_b0);
      poVar6 = std::operator<<(poVar6," because the search direction vector is exactly zero");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::vector<double,_std::allocator<double>_>::vector
                (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)this);
      goto LAB_0019d41b;
    }
    dStack_100 = dStack_48 / dgg;
    for (local_104 = 0;
        local_104 <
        g.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; local_104 = local_104 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->
                           super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                           ).xi,(long)local_104);
      vVar2 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_68,(long)local_104);
      *pvVar5 = -vVar2;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_68,(long)local_104);
      dVar3 = dStack_100;
      dVar11 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_98,(long)local_104);
      dVar11 = dVar3 * *pvVar5 + dVar11;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_98,(long)local_104);
      *pvVar5 = dVar11;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->
                           super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                           ).xi,(long)local_104);
      *pvVar5 = dVar11;
    }
    local_b0 = local_b0 + 1;
  }
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0x11);
  poVar6 = std::operator<<((ostream *)&std::cout,"#Convergence met at iteration ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_b0);
  poVar6 = std::operator<<(poVar6,
                           " because the relative difference in F(p) between 2 consecutive iteration is smaller than "
                          );
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::scientific);
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,(this->
                             super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                             ).ftol);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)this);
LAB_0019d41b:
  test._0_4_ = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_98);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

VecDoub minimize(VecDoub_I &pp)
	{
		const Int ITMAX=2000000000;
		const Doub EPS=numeric_limits<Doub>::epsilon();
		const Doub GTOL=ftol;
		Doub gg,dgg;
		Int n=pp.size();
		p=pp;
		VecDoub g(n),h(n);
		xi.resize(n);
		Doub fp=func(p);
		func.df(p,xi);
		for (Int j=0;j<n;j++) {
			g[j] = -xi[j];
			xi[j]=h[j]=g[j];
		}
		for (Int its=0;its<ITMAX;its++) {
		        if(!(its % 100)) {
			  cout << "#At iteration: " << its << " states are:\n";
			  cout.precision(VALMAXDIGITS10); 
			  for(uint i = 0; i < p.size(); ++i) cout << "#\t" << i << "\t" << p[i] << endl;
			  cout.flush();
			}
			iter=its;
			fret=linmin();
			if (2.0*abs(fret-fp) <= ftol*(abs(fret)+abs(fp)+EPS)) {
			  cout.precision(VALMAXDIGITS10);
			  cout << "#Convergence met at iteration " << its << " because the relative difference in F(p) between 2 consecutive iteration is smaller than " << scientific << ftol << endl;
				return p;
			}
			fp=fret;
			func.df(p,xi);
			Doub test=0.0;
			Doub den=MAX(fp, Doub{1.0});
			for (Int j=0;j<n;j++) {
				Doub temp=abs(xi[j])*MAX(abs(p[j]),Doub{1.0})/den;
				if (temp > test) test=temp;
			}
			if (test < GTOL) { 
			  cout.precision(VALMAXDIGITS10); 
			  cout << "#Convergence met at iteration " << its << " because gradient is smaller than " << GTOL << endl;
			  return p;
			}
			dgg=gg=0.0;
			for (Int j=0;j<n;j++) {
				gg += g[j]*g[j];
//			  dgg += xi[j]*xi[j];
				dgg += (xi[j]+g[j])*xi[j];
			}
			if (gg == 0.0) {
			  cout << "#Convergence met at iteration " << its << " because the search direction vector is exactly zero" << endl;
			  return p;
			}
			Doub gam=dgg/gg;
			for (Int j=0;j<n;j++) {
				g[j] = -xi[j];
				xi[j]=h[j]=g[j]+gam*h[j];
			}
		}
		throw(General_Exception("Too many iterations in frprmn"));
	}